

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O0

void __thiscall FBackdropTexture::FBackdropTexture(FBackdropTexture *this)

{
  uint32_t uVar1;
  double dVar2;
  int local_14;
  int i;
  FBackdropTexture *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FBackdropTexture_009eec08;
  (this->super_FTexture).Width = 0x90;
  (this->super_FTexture).Height = 0xa0;
  (this->super_FTexture).WidthBits = '\b';
  (this->super_FTexture).HeightBits = '\b';
  (this->super_FTexture).WidthMask = 0xff;
  this->LastRenderTic = 0;
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    dVar2 = cos((double)local_14 * 0.02454369260617026);
    *(int *)(&(this->super_FTexture).field_0x54 + (long)local_14 * 4) = (int)(long)(dVar2 * 65536.0)
    ;
  }
  uVar1 = DEGREES(180.0);
  this->time1 = uVar1;
  uVar1 = DEGREES(56.0);
  this->time2 = uVar1;
  uVar1 = DEGREES(99.0);
  this->time3 = uVar1;
  uVar1 = DEGREES(1.0);
  this->time4 = uVar1;
  uVar1 = DEGREES(90.0);
  this->t1ang = uVar1;
  this->t2ang = 0;
  this->z1ang = 0;
  uVar1 = DEGREES(45.0);
  this->z2ang = uVar1;
  return;
}

Assistant:

FBackdropTexture::FBackdropTexture()
{
	Width = 144;
	Height = 160;
	WidthBits = 8;
	HeightBits = 8;
	WidthMask = 255;
	LastRenderTic = 0;

	for (int i = 0; i < COS_SIZE; ++i)
	{
		costab[i] = uint32_t(cos(i * (M_PI / (COS_SIZE / 2))) * 65536);
	}

	time1 = DEGREES(180);
	time2 = DEGREES(56);
	time3 = DEGREES(99);
	time4 = DEGREES(1);
	t1ang = DEGREES(90);
	t2ang = 0;
	z1ang = 0;
	z2ang = DEGREES(45);
}